

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *p,Gia_Obj_t *pObj,int f,int fUseId)

{
  sat_solver2 *psVar1;
  Gia_Man_t *p_00;
  bool bVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *p_01;
  int iVar5;
  int iVar6;
  uint uVar7;
  Vec_Int_t *vCnf0;
  Vec_Int_t *vCnf1;
  int *piVar8;
  bool bVar9;
  int local_ac;
  int local_5c;
  uint uTruth;
  int fUseStatic;
  int iLitOut;
  int Lit;
  int k;
  Gia_Obj_t *pLeaf;
  Vec_Int_t *vLeaves;
  int fUseId_local;
  int f_local;
  Gia_Obj_t *pObj_local;
  Ga2_Man_t *p_local;
  
  vLeaves._0_4_ = fUseId;
  vLeaves._4_4_ = f;
  _fUseId_local = pObj;
  pObj_local = (Gia_Obj_t *)p;
  uTruth = Ga2_ObjFindOrAddLit(p,pObj,f);
  if ((int)uTruth < 2) {
    __assert_fail("iLitOut > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x31d,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
  }
  iVar5 = Gia_ObjIsConst0(_fUseId_local);
  if (((iVar5 == 0) && (iVar5 = Gia_ObjIsRo(*(Gia_Man_t **)pObj_local,_fUseId_local), iVar5 == 0))
     && (iVar5 = Gia_ObjIsAnd(_fUseId_local), iVar5 == 0)) {
    __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x31e,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
  }
  iVar5 = Gia_ObjIsConst0(_fUseId_local);
  if ((iVar5 == 0) &&
     ((vLeaves._4_4_ != 0 ||
      (iVar5 = Gia_ObjIsRo(*(Gia_Man_t **)pObj_local,_fUseId_local), iVar5 == 0)))) {
    bVar2 = true;
    Vec_IntClear(*(Vec_Int_t **)(pObj_local + 0xc));
    pLeaf = (Gia_Obj_t *)Ga2_ObjLeaves(*(Gia_Man_t **)pObj_local,_fUseId_local);
    iLitOut = 0;
    while( true ) {
      iVar5 = iLitOut;
      iVar6 = Vec_IntSize((Vec_Int_t *)pLeaf);
      bVar9 = false;
      if (iVar5 < iVar6) {
        p_00 = *(Gia_Man_t **)pObj_local;
        iVar5 = Vec_IntEntry((Vec_Int_t *)pLeaf,iLitOut);
        _Lit = Gia_ManObj(p_00,iVar5);
        bVar9 = _Lit != (Gia_Obj_t *)0x0;
      }
      p_01 = pObj_local;
      iVar5 = vLeaves._4_4_;
      pGVar4 = _Lit;
      if (!bVar9) break;
      iVar6 = Gia_ObjIsRo(*(Gia_Man_t **)pObj_local,_fUseId_local);
      fUseStatic = Ga2_ObjFindOrAddLit((Ga2_Man_t *)p_01,pGVar4,iVar5 - iVar6);
      Vec_IntPush(*(Vec_Int_t **)(pObj_local + 0xc),fUseStatic);
      if (fUseStatic < 2) {
        bVar2 = false;
      }
      iLitOut = iLitOut + 1;
    }
    if ((bVar2) || (iVar5 = Gia_ObjIsRo(*(Gia_Man_t **)pObj_local,_fUseId_local), iVar5 != 0)) {
      psVar1 = *(sat_solver2 **)(pObj_local + 8);
      vCnf0 = Ga2_ObjCnf0((Ga2_Man_t *)pObj_local,_fUseId_local);
      vCnf1 = Ga2_ObjCnf1((Ga2_Man_t *)pObj_local,_fUseId_local);
      piVar8 = Vec_IntArray(*(Vec_Int_t **)(pObj_local + 0xc));
      uVar3 = uTruth;
      if ((int)vLeaves == 0) {
        local_ac = -1;
      }
      else {
        local_ac = Gia_ObjId(*(Gia_Man_t **)pObj_local,_fUseId_local);
      }
      Ga2_ManCnfAddStatic(psVar1,vCnf0,vCnf1,piVar8,uVar3,local_ac);
    }
    else {
      uVar7 = Ga2_ObjComputeTruthSpecial
                        (*(Gia_Man_t **)pObj_local,_fUseId_local,(Vec_Int_t *)pLeaf,
                         *(Vec_Int_t **)(pObj_local + 0xc));
      pGVar4 = pObj_local;
      piVar8 = Vec_IntArray(*(Vec_Int_t **)(pObj_local + 0xc));
      uVar3 = uTruth;
      iVar5 = Gia_ObjId(*(Gia_Man_t **)pObj_local,_fUseId_local);
      Ga2_ManCnfAddDynamic((Ga2_Man_t *)pGVar4,uVar7 & 0xffff,piVar8,uVar3,iVar5);
    }
  }
  else {
    uTruth = Abc_LitNot(uTruth);
    psVar1 = *(sat_solver2 **)(pObj_local + 8);
    if ((int)vLeaves == 0) {
      local_5c = -1;
    }
    else {
      local_5c = Gia_ObjId(*(Gia_Man_t **)pObj_local,_fUseId_local);
    }
    sat_solver2_addclause(psVar1,(lit *)&uTruth,&fUseStatic,local_5c);
  }
  return;
}

Assistant:

static inline void Ga2_ManAddToAbsOneStatic( Ga2_Man_t * p, Gia_Obj_t * pObj, int f, int fUseId )
{
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pLeaf;
    int k, Lit, iLitOut = Ga2_ObjFindOrAddLit( p, pObj, f );
    assert( iLitOut > 1 );
    assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsConst0(pObj) || (f == 0 && Gia_ObjIsRo(p->pGia, pObj)) )
    {
        iLitOut = Abc_LitNot( iLitOut );
        sat_solver2_addclause( p->pSat, &iLitOut, &iLitOut + 1, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
    }
    else
    {
        int fUseStatic = 1;
        Vec_IntClear( p->vLits );
        vLeaves = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vLeaves, p->pGia, pLeaf, k )
        {
            Lit = Ga2_ObjFindOrAddLit( p, pLeaf, f - Gia_ObjIsRo(p->pGia, pObj) );
            Vec_IntPush( p->vLits, Lit );
            if ( Lit < 2 )
                fUseStatic = 0;
        }
        if ( fUseStatic || Gia_ObjIsRo(p->pGia, pObj) )
            Ga2_ManCnfAddStatic( p->pSat, Ga2_ObjCnf0(p, pObj), Ga2_ObjCnf1(p, pObj), Vec_IntArray(p->vLits), iLitOut, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
        else
        {
            unsigned uTruth = Ga2_ObjComputeTruthSpecial( p->pGia, pObj, vLeaves, p->vLits );
            Ga2_ManCnfAddDynamic( p, uTruth & 0xFFFF, Vec_IntArray(p->vLits), iLitOut, Gia_ObjId(p->pGia, pObj) );
        }
    }
}